

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

string * __thiscall
util::make_string<char_const(&)[22],unsigned_char&,char_const(&)[12],unsigned_char&>
          (string *__return_storage_ptr__,util *this,char (*args) [22],uchar *args_1,
          char (*args_2) [12],uchar *args_3)

{
  size_t sVar1;
  ostringstream ss;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  sVar1 = strlen((char *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,(char *)this,sVar1);
  std::ostream::operator<<((ostream *)aoStack_1a8,(uint)(byte)(*args)[0]);
  sVar1 = strlen((char *)args_1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,(char *)args_1,sVar1);
  std::ostream::operator<<((ostream *)aoStack_1a8,(uint)(byte)(*args_2)[0]);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}